

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O2

int collectPendingSignalWithDSC(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  Abc_Obj_t *pObj;
  char *pcVar1;
  int i;
  
  i = 0;
  while( true ) {
    if (pAig->nTruePos <= i) {
      return -1;
    }
    Vec_PtrEntry(pAig->vCos,i);
    pObj = Abc_NtkPo(pNtk,i);
    pcVar1 = Abc_ObjName(pObj);
    pcVar1 = strstr(pcVar1,"pendingSignal");
    if (pcVar1 != (char *)0x0) break;
    i = i + 1;
  }
  return i;
}

Assistant:

int collectPendingSignalWithDSC( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    int i;
    Aig_Obj_t *pObj;

    Saig_ManForEachPo( pAig, pObj, i )
    {
        if( strstr( Abc_ObjName(Abc_NtkPo( pNtk, i )), "pendingSignal" ) != NULL )
            return i;            
    }
    
    return -1;
}